

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall
ImPool<ImGuiDockContextPruneNodeData>::Clear(ImPool<ImGuiDockContextPruneNodeData> *this)

{
  ImVector<ImGuiStorage::ImGuiStoragePair>::clear(&(this->Map).Data);
  ImVector<ImGuiDockContextPruneNodeData>::clear(&this->Buf);
  this->FreeIdx = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Buf[idx].~T(); } Map.Clear(); Buf.clear(); FreeIdx = 0; }